

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::IOException::
IOException<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
          (IOException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3,unsigned_long params_4)

{
  pointer pcVar1;
  _Alloc_hider params_4_00;
  char local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_4_00._M_p = local_80;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff70,pcVar1,pcVar1 + params->_M_string_length);
  pcVar1 = (params_2->_M_dataplus)._M_p;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + params_2->_M_string_length);
  Exception::
  ConstructMessage<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
            (&local_50,(Exception *)msg,(string *)&stack0xffffffffffffff70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1,
             (unsigned_long)local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_3,params_4,
             (unsigned_long)params_4_00._M_p);
  IOException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (params_4_00._M_p != local_80) {
    operator_delete(params_4_00._M_p);
  }
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}